

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::save_sections(elfio *this,ostream *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer peVar5;
  undefined4 extraout_var;
  streamoff sVar6;
  pointer psVar7;
  pointer psVar8;
  undefined4 extraout_var_00;
  fpos<__mbstate_t> local_78;
  streamoff local_68;
  streamoff local_60;
  fpos<__mbstate_t> local_58;
  undefined1 local_48 [8];
  streampos headerPosition;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *sec;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  *__range2;
  ostream *stream_local;
  elfio *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ::begin(&this->sections_);
  sec = (unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
        std::
        vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
        ::end(&this->sections_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                                *)&sec);
    if (!bVar1) break;
    headerPosition._M_state =
         (__mbstate_t)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
         ::operator*(&__end2);
    peVar5 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    iVar2 = (*peVar5->_vptr_elf_header[0x1a])();
    peVar5 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    uVar3 = (*peVar5->_vptr_elf_header[8])();
    std::fpos<__mbstate_t>::fpos(&local_58,(ulong)(uVar3 & 0xffff));
    sVar6 = std::fpos::operator_cast_to_long((fpos *)&local_58);
    psVar7 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                       ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                        headerPosition._M_state);
    iVar4 = (*psVar7->_vptr_section[2])();
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)local_48,
               CONCAT44(extraout_var,iVar2) + sVar6 * (ulong)(ushort)iVar4);
    psVar7 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                       ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                        headerPosition._M_state);
    local_68 = (streamoff)local_48;
    local_60 = headerPosition._M_off;
    psVar8 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                       ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                        headerPosition._M_state);
    iVar2 = (*psVar8->_vptr_section[0x17])();
    std::fpos<__mbstate_t>::fpos(&local_78,CONCAT44(extraout_var_00,iVar2));
    (*psVar7->_vptr_section[0x25])
              (psVar7,stream,local_68,local_60,local_78._M_off,local_78._M_state);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool save_sections( std::ostream& stream ) const
    {
        for ( const auto& sec : sections_ ) {
            std::streampos headerPosition =
                static_cast<std::streamoff>( header->get_sections_offset() ) +
                static_cast<std::streampos>(
                    header->get_section_entry_size() ) *
                    sec->get_index();

            sec->save( stream, headerPosition, sec->get_offset() );
        }
        return true;
    }